

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx::BVHNIntersector1<4,_16781328,_false,_embree::avx::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  float fVar4;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  char cVar15;
  AABBNodeMB4D *node1;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  ulong *puVar21;
  ulong uVar22;
  ulong uVar23;
  float fVar24;
  float fVar30;
  float fVar31;
  vint4 bi_1;
  undefined1 auVar25 [16];
  float fVar32;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  vint4 bi_3;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar48;
  float fVar49;
  vint4 bi;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  float fVar50;
  undefined1 auVar47 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  float fVar56;
  float fVar64;
  float fVar65;
  vint4 ai_1;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  float fVar66;
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  float fVar67;
  vfloat4 a0;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  vint4 ai_3;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  Precalculations pre;
  NodeRef stack [244];
  float local_818 [4];
  undefined1 local_808 [16];
  undefined1 local_7f8 [16];
  undefined1 local_7e8 [16];
  ulong local_7d8;
  ulong local_7d0 [244];
  
  local_7d8 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_7d8 != 8) {
    fVar41 = ray->tfar;
    if (0.0 <= fVar41) {
      aVar5 = (ray->dir).field_0.field_1;
      auVar42 = vdpps_avx((undefined1  [16])aVar5,(undefined1  [16])aVar5,0x7f);
      auVar43 = vrsqrtss_avx(auVar42,auVar42);
      fVar67 = auVar43._0_4_;
      local_818[0] = fVar67 * 1.5 - auVar42._0_4_ * 0.5 * fVar67 * fVar67 * fVar67;
      fVar67 = (ray->dir).field_0.m128[0];
      fVar3 = (ray->dir).field_0.m128[1];
      fVar4 = (ray->dir).field_0.m128[2];
      auVar33 = vshufps_avx(ZEXT416((uint)local_818[0]),ZEXT416((uint)local_818[0]),0);
      auVar68._0_4_ = aVar5.x * auVar33._0_4_;
      auVar68._4_4_ = aVar5.y * auVar33._4_4_;
      auVar68._8_4_ = aVar5.z * auVar33._8_4_;
      auVar68._12_4_ = aVar5.field_3.w * auVar33._12_4_;
      auVar43 = vshufpd_avx(auVar68,auVar68,1);
      auVar42 = vmovshdup_avx(auVar68);
      auVar80._8_4_ = 0x80000000;
      auVar80._0_8_ = 0x8000000080000000;
      auVar80._12_4_ = 0x80000000;
      auVar74._12_4_ = 0;
      auVar74._0_12_ = ZEXT812(0);
      auVar74 = auVar74 << 0x20;
      auVar25 = vunpckhps_avx(auVar68,auVar74);
      auVar57 = vshufps_avx(auVar25,ZEXT416(auVar42._0_4_ ^ 0x80000000),0x41);
      auVar77._0_8_ = auVar43._0_8_ ^ 0x8000000080000000;
      auVar77._8_8_ = auVar43._8_8_ ^ auVar80._8_8_;
      auVar25 = vinsertps_avx(auVar77,auVar68,0x2a);
      auVar42 = vdpps_avx(auVar57,auVar57,0x7f);
      auVar43 = vdpps_avx(auVar25,auVar25,0x7f);
      auVar42 = vcmpps_avx(auVar43,auVar42,1);
      auVar42 = vshufps_avx(auVar42,auVar42,0);
      auVar42 = vblendvps_avx(auVar25,auVar57,auVar42);
      auVar43 = vdpps_avx(auVar42,auVar42,0x7f);
      auVar25 = vrsqrtss_avx(auVar43,auVar43);
      fVar76 = auVar25._0_4_;
      auVar43 = ZEXT416((uint)(fVar76 * 1.5 - auVar43._0_4_ * 0.5 * fVar76 * fVar76 * fVar76));
      auVar43 = vshufps_avx(auVar43,auVar43,0);
      auVar78._0_4_ = auVar42._0_4_ * auVar43._0_4_;
      auVar78._4_4_ = auVar42._4_4_ * auVar43._4_4_;
      auVar78._8_4_ = auVar42._8_4_ * auVar43._8_4_;
      auVar78._12_4_ = auVar42._12_4_ * auVar43._12_4_;
      auVar42 = vshufps_avx(auVar78,auVar78,0xc9);
      auVar43 = vshufps_avx(auVar68,auVar68,0xc9);
      auVar83._0_4_ = auVar43._0_4_ * auVar78._0_4_;
      auVar83._4_4_ = auVar43._4_4_ * auVar78._4_4_;
      auVar83._8_4_ = auVar43._8_4_ * auVar78._8_4_;
      auVar83._12_4_ = auVar43._12_4_ * auVar78._12_4_;
      auVar81._0_4_ = auVar42._0_4_ * auVar68._0_4_;
      auVar81._4_4_ = auVar42._4_4_ * auVar68._4_4_;
      auVar81._8_4_ = auVar42._8_4_ * auVar68._8_4_;
      auVar81._12_4_ = auVar42._12_4_ * auVar68._12_4_;
      auVar42 = vsubps_avx(auVar81,auVar83);
      auVar25 = vshufps_avx(auVar42,auVar42,0xc9);
      auVar42 = vdpps_avx(auVar25,auVar25,0x7f);
      auVar43 = vrsqrtss_avx(auVar42,auVar42);
      fVar76 = auVar43._0_4_;
      auVar42 = ZEXT416((uint)(fVar76 * 1.5 - auVar42._0_4_ * 0.5 * fVar76 * fVar76 * fVar76));
      auVar42 = vshufps_avx(auVar42,auVar42,0);
      auVar43._0_4_ = auVar25._0_4_ * auVar42._0_4_;
      auVar43._4_4_ = auVar25._4_4_ * auVar42._4_4_;
      auVar43._8_4_ = auVar25._8_4_ * auVar42._8_4_;
      auVar43._12_4_ = auVar25._12_4_ * auVar42._12_4_;
      auVar42._0_4_ = auVar33._0_4_ * auVar68._0_4_;
      auVar42._4_4_ = auVar33._4_4_ * auVar68._4_4_;
      auVar42._8_4_ = auVar33._8_4_ * auVar68._8_4_;
      auVar42._12_4_ = auVar33._12_4_ * auVar68._12_4_;
      auVar25 = vunpcklps_avx(auVar78,auVar42);
      auVar42 = vunpckhps_avx(auVar78,auVar42);
      auVar33 = vunpcklps_avx(auVar43,auVar74);
      auVar43 = vunpckhps_avx(auVar43,auVar74);
      local_7e8 = vunpcklps_avx(auVar42,auVar43);
      local_808 = vunpcklps_avx(auVar25,auVar33);
      local_7f8 = vunpckhps_avx(auVar25,auVar33);
      puVar21 = local_7d0;
      auVar43 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar25._8_4_ = 0x7fffffff;
      auVar25._0_8_ = 0x7fffffff7fffffff;
      auVar25._12_4_ = 0x7fffffff;
      auVar42 = vandps_avx((undefined1  [16])aVar5,auVar25);
      auVar57._8_4_ = 0x219392ef;
      auVar57._0_8_ = 0x219392ef219392ef;
      auVar57._12_4_ = 0x219392ef;
      auVar42 = vcmpps_avx(auVar42,auVar57,1);
      auVar42 = vblendvps_avx((undefined1  [16])aVar5,auVar57,auVar42);
      auVar25 = vrcpps_avx(auVar42);
      fVar76 = auVar25._0_4_;
      auVar33._0_4_ = auVar42._0_4_ * fVar76;
      fVar7 = auVar25._4_4_;
      auVar33._4_4_ = auVar42._4_4_ * fVar7;
      fVar8 = auVar25._8_4_;
      auVar33._8_4_ = auVar42._8_4_ * fVar8;
      fVar85 = auVar25._12_4_;
      auVar33._12_4_ = auVar42._12_4_ * fVar85;
      auVar58._8_4_ = 0x3f800000;
      auVar58._0_8_ = 0x3f8000003f800000;
      auVar58._12_4_ = 0x3f800000;
      auVar42 = vsubps_avx(auVar58,auVar33);
      auVar34._0_4_ = fVar76 + fVar76 * auVar42._0_4_;
      auVar34._4_4_ = fVar7 + fVar7 * auVar42._4_4_;
      auVar34._8_4_ = fVar8 + fVar8 * auVar42._8_4_;
      auVar34._12_4_ = fVar85 + fVar85 * auVar42._12_4_;
      fVar76 = (ray->org).field_0.m128[0];
      auVar82._4_4_ = fVar76;
      auVar82._0_4_ = fVar76;
      auVar82._8_4_ = fVar76;
      auVar82._12_4_ = fVar76;
      fVar7 = (ray->org).field_0.m128[1];
      auVar84._4_4_ = fVar7;
      auVar84._0_4_ = fVar7;
      auVar84._8_4_ = fVar7;
      auVar84._12_4_ = fVar7;
      fVar8 = (ray->org).field_0.m128[2];
      auVar33 = vshufps_avx(auVar34,auVar34,0);
      auVar42 = vmovshdup_avx(auVar34);
      auVar57 = vshufps_avx(auVar34,auVar34,0x55);
      uVar23 = (ulong)(auVar34._0_4_ < 0.0) * 0x10;
      auVar25 = vshufpd_avx(auVar34,auVar34,1);
      auVar74 = vshufps_avx(auVar34,auVar34,0xaa);
      uVar22 = (ulong)(auVar42._0_4_ < 0.0) << 4 | 0x20;
      uVar20 = (ulong)(auVar25._0_4_ < 0.0) << 4 | 0x40;
      auVar42 = vshufps_avx(auVar43,auVar43,0);
      auVar43 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
LAB_002bc6fd:
      do {
        if (puVar21 == &local_7d8) {
          return;
        }
        uVar17 = puVar21[-1];
        puVar21 = puVar21 + -1;
        while ((uVar17 & 8) == 0) {
          fVar41 = (ray->dir).field_0.m128[3];
          uVar18 = (uint)uVar17 & 7;
          uVar16 = uVar17 & 0xfffffffffffffff0;
          if (uVar18 == 3) {
            auVar25 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
            fVar41 = 1.0 - fVar41;
            fVar56 = auVar25._0_4_;
            fVar64 = auVar25._4_4_;
            fVar65 = auVar25._8_4_;
            fVar66 = auVar25._12_4_;
            auVar25 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
            auVar34 = vshufps_avx(ZEXT416((uint)(fVar41 * 0.0)),ZEXT416((uint)(fVar41 * 0.0)),0);
            fVar24 = auVar34._0_4_;
            fVar30 = auVar34._4_4_;
            fVar31 = auVar34._8_4_;
            fVar32 = auVar34._12_4_;
            fVar89 = auVar25._0_4_;
            auVar79._0_4_ = fVar89 + fVar56 * *(float *)(uVar16 + 0x110);
            fVar90 = auVar25._4_4_;
            auVar79._4_4_ = fVar90 + fVar64 * *(float *)(uVar16 + 0x114);
            fVar91 = auVar25._8_4_;
            auVar79._8_4_ = fVar91 + fVar65 * *(float *)(uVar16 + 0x118);
            fVar92 = auVar25._12_4_;
            auVar79._12_4_ = fVar92 + fVar66 * *(float *)(uVar16 + 0x11c);
            auVar26._0_4_ =
                 *(float *)(uVar16 + 0x20) * fVar67 +
                 *(float *)(uVar16 + 0x50) * fVar3 + *(float *)(uVar16 + 0x80) * fVar4;
            auVar26._4_4_ =
                 *(float *)(uVar16 + 0x24) * fVar67 +
                 *(float *)(uVar16 + 0x54) * fVar3 + *(float *)(uVar16 + 0x84) * fVar4;
            auVar26._8_4_ =
                 *(float *)(uVar16 + 0x28) * fVar67 +
                 *(float *)(uVar16 + 0x58) * fVar3 + *(float *)(uVar16 + 0x88) * fVar4;
            auVar26._12_4_ =
                 *(float *)(uVar16 + 0x2c) * fVar67 +
                 *(float *)(uVar16 + 0x5c) * fVar3 + *(float *)(uVar16 + 0x8c) * fVar4;
            auVar37._0_4_ =
                 fVar3 * *(float *)(uVar16 + 0x60) + *(float *)(uVar16 + 0x90) * fVar4 +
                 *(float *)(uVar16 + 0x30) * fVar67;
            auVar37._4_4_ =
                 fVar3 * *(float *)(uVar16 + 100) + *(float *)(uVar16 + 0x94) * fVar4 +
                 *(float *)(uVar16 + 0x34) * fVar67;
            auVar37._8_4_ =
                 fVar3 * *(float *)(uVar16 + 0x68) + *(float *)(uVar16 + 0x98) * fVar4 +
                 *(float *)(uVar16 + 0x38) * fVar67;
            auVar37._12_4_ =
                 fVar3 * *(float *)(uVar16 + 0x6c) + *(float *)(uVar16 + 0x9c) * fVar4 +
                 *(float *)(uVar16 + 0x3c) * fVar67;
            auVar61._0_4_ =
                 fVar3 * *(float *)(uVar16 + 0x70) + fVar4 * *(float *)(uVar16 + 0xa0) +
                 *(float *)(uVar16 + 0x40) * fVar67;
            auVar61._4_4_ =
                 fVar3 * *(float *)(uVar16 + 0x74) + fVar4 * *(float *)(uVar16 + 0xa4) +
                 *(float *)(uVar16 + 0x44) * fVar67;
            auVar61._8_4_ =
                 fVar3 * *(float *)(uVar16 + 0x78) + fVar4 * *(float *)(uVar16 + 0xa8) +
                 *(float *)(uVar16 + 0x48) * fVar67;
            auVar61._12_4_ =
                 fVar3 * *(float *)(uVar16 + 0x7c) + fVar4 * *(float *)(uVar16 + 0xac) +
                 *(float *)(uVar16 + 0x4c) * fVar67;
            auVar46._8_4_ = 0x7fffffff;
            auVar46._0_8_ = 0x7fffffff7fffffff;
            auVar46._12_4_ = 0x7fffffff;
            auVar25 = vandps_avx(auVar26,auVar46);
            auVar71._8_4_ = 0x219392ef;
            auVar71._0_8_ = 0x219392ef219392ef;
            auVar71._12_4_ = 0x219392ef;
            auVar25 = vcmpps_avx(auVar25,auVar71,1);
            auVar34 = vblendvps_avx(auVar26,auVar71,auVar25);
            auVar25 = vandps_avx(auVar37,auVar46);
            auVar25 = vcmpps_avx(auVar25,auVar71,1);
            auVar58 = vblendvps_avx(auVar37,auVar71,auVar25);
            auVar25 = vandps_avx(auVar61,auVar46);
            auVar25 = vcmpps_avx(auVar25,auVar71,1);
            auVar25 = vblendvps_avx(auVar61,auVar71,auVar25);
            auVar68 = vrcpps_avx(auVar34);
            fVar93 = auVar68._0_4_;
            auVar27._0_4_ = fVar93 * auVar34._0_4_;
            fVar94 = auVar68._4_4_;
            auVar27._4_4_ = fVar94 * auVar34._4_4_;
            fVar95 = auVar68._8_4_;
            auVar27._8_4_ = fVar95 * auVar34._8_4_;
            fVar96 = auVar68._12_4_;
            auVar27._12_4_ = fVar96 * auVar34._12_4_;
            auVar72._8_4_ = 0x3f800000;
            auVar72._0_8_ = 0x3f8000003f800000;
            auVar72._12_4_ = 0x3f800000;
            auVar34 = vsubps_avx(auVar72,auVar27);
            fVar93 = fVar93 + fVar93 * auVar34._0_4_;
            fVar94 = fVar94 + fVar94 * auVar34._4_4_;
            fVar95 = fVar95 + fVar95 * auVar34._8_4_;
            fVar96 = fVar96 + fVar96 * auVar34._12_4_;
            auVar34 = vrcpps_avx(auVar58);
            fVar41 = auVar34._0_4_;
            auVar38._0_4_ = auVar58._0_4_ * fVar41;
            fVar48 = auVar34._4_4_;
            auVar38._4_4_ = auVar58._4_4_ * fVar48;
            fVar49 = auVar34._8_4_;
            auVar38._8_4_ = auVar58._8_4_ * fVar49;
            fVar50 = auVar34._12_4_;
            auVar38._12_4_ = auVar58._12_4_ * fVar50;
            auVar34 = vsubps_avx(auVar72,auVar38);
            fVar41 = fVar41 + fVar41 * auVar34._0_4_;
            fVar48 = fVar48 + fVar48 * auVar34._4_4_;
            fVar49 = fVar49 + fVar49 * auVar34._8_4_;
            fVar50 = fVar50 + fVar50 * auVar34._12_4_;
            auVar34 = vrcpps_avx(auVar25);
            fVar85 = auVar34._0_4_;
            auVar62._0_4_ = auVar25._0_4_ * fVar85;
            fVar86 = auVar34._4_4_;
            auVar62._4_4_ = auVar25._4_4_ * fVar86;
            fVar87 = auVar34._8_4_;
            auVar62._8_4_ = auVar25._8_4_ * fVar87;
            fVar88 = auVar34._12_4_;
            auVar62._12_4_ = auVar25._12_4_ * fVar88;
            auVar25 = vsubps_avx(auVar72,auVar62);
            fVar85 = fVar85 + fVar85 * auVar25._0_4_;
            fVar86 = fVar86 + fVar86 * auVar25._4_4_;
            fVar87 = fVar87 + fVar87 * auVar25._8_4_;
            fVar88 = fVar88 + fVar88 * auVar25._12_4_;
            auVar28._0_4_ =
                 fVar76 * *(float *)(uVar16 + 0x20) +
                 *(float *)(uVar16 + 0x50) * fVar7 +
                 *(float *)(uVar16 + 0x80) * fVar8 + *(float *)(uVar16 + 0xb0);
            auVar28._4_4_ =
                 fVar76 * *(float *)(uVar16 + 0x24) +
                 *(float *)(uVar16 + 0x54) * fVar7 +
                 *(float *)(uVar16 + 0x84) * fVar8 + *(float *)(uVar16 + 0xb4);
            auVar28._8_4_ =
                 fVar76 * *(float *)(uVar16 + 0x28) +
                 *(float *)(uVar16 + 0x58) * fVar7 +
                 *(float *)(uVar16 + 0x88) * fVar8 + *(float *)(uVar16 + 0xb8);
            auVar28._12_4_ =
                 fVar76 * *(float *)(uVar16 + 0x2c) +
                 *(float *)(uVar16 + 0x5c) * fVar7 +
                 *(float *)(uVar16 + 0x8c) * fVar8 + *(float *)(uVar16 + 0xbc);
            auVar39._0_4_ =
                 fVar76 * *(float *)(uVar16 + 0x30) +
                 fVar7 * *(float *)(uVar16 + 0x60) +
                 *(float *)(uVar16 + 0x90) * fVar8 + *(float *)(uVar16 + 0xc0);
            auVar39._4_4_ =
                 fVar76 * *(float *)(uVar16 + 0x34) +
                 fVar7 * *(float *)(uVar16 + 100) +
                 *(float *)(uVar16 + 0x94) * fVar8 + *(float *)(uVar16 + 0xc4);
            auVar39._8_4_ =
                 fVar76 * *(float *)(uVar16 + 0x38) +
                 fVar7 * *(float *)(uVar16 + 0x68) +
                 *(float *)(uVar16 + 0x98) * fVar8 + *(float *)(uVar16 + 200);
            auVar39._12_4_ =
                 fVar76 * *(float *)(uVar16 + 0x3c) +
                 fVar7 * *(float *)(uVar16 + 0x6c) +
                 *(float *)(uVar16 + 0x9c) * fVar8 + *(float *)(uVar16 + 0xcc);
            auVar55._0_4_ =
                 fVar76 * *(float *)(uVar16 + 0x40) +
                 fVar7 * *(float *)(uVar16 + 0x70) +
                 fVar8 * *(float *)(uVar16 + 0xa0) + *(float *)(uVar16 + 0xd0);
            auVar55._4_4_ =
                 fVar76 * *(float *)(uVar16 + 0x44) +
                 fVar7 * *(float *)(uVar16 + 0x74) +
                 fVar8 * *(float *)(uVar16 + 0xa4) + *(float *)(uVar16 + 0xd4);
            auVar55._8_4_ =
                 fVar76 * *(float *)(uVar16 + 0x48) +
                 fVar7 * *(float *)(uVar16 + 0x78) +
                 fVar8 * *(float *)(uVar16 + 0xa8) + *(float *)(uVar16 + 0xd8);
            auVar55._12_4_ =
                 fVar76 * *(float *)(uVar16 + 0x4c) +
                 fVar7 * *(float *)(uVar16 + 0x7c) +
                 fVar8 * *(float *)(uVar16 + 0xac) + *(float *)(uVar16 + 0xdc);
            auVar11._4_4_ = fVar30 + fVar64 * *(float *)(uVar16 + 0xe4);
            auVar11._0_4_ = fVar24 + fVar56 * *(float *)(uVar16 + 0xe0);
            auVar11._8_4_ = fVar31 + fVar65 * *(float *)(uVar16 + 0xe8);
            auVar11._12_4_ = fVar32 + fVar66 * *(float *)(uVar16 + 0xec);
            auVar25 = vsubps_avx(auVar11,auVar28);
            auVar34 = vsubps_avx(auVar79,auVar28);
            auVar14._4_4_ = fVar30 + fVar64 * *(float *)(uVar16 + 0xf4);
            auVar14._0_4_ = fVar24 + fVar56 * *(float *)(uVar16 + 0xf0);
            auVar14._8_4_ = fVar31 + fVar65 * *(float *)(uVar16 + 0xf8);
            auVar14._12_4_ = fVar32 + fVar66 * *(float *)(uVar16 + 0xfc);
            auVar58 = vsubps_avx(auVar14,auVar39);
            auVar12._4_4_ = fVar90 + fVar64 * *(float *)(uVar16 + 0x124);
            auVar12._0_4_ = fVar89 + fVar56 * *(float *)(uVar16 + 0x120);
            auVar12._8_4_ = fVar91 + fVar65 * *(float *)(uVar16 + 0x128);
            auVar12._12_4_ = fVar92 + fVar66 * *(float *)(uVar16 + 300);
            auVar68 = vsubps_avx(auVar12,auVar39);
            auVar9._4_4_ = fVar64 * *(float *)(uVar16 + 0x104) + fVar30;
            auVar9._0_4_ = fVar56 * *(float *)(uVar16 + 0x100) + fVar24;
            auVar9._8_4_ = fVar65 * *(float *)(uVar16 + 0x108) + fVar31;
            auVar9._12_4_ = fVar66 * *(float *)(uVar16 + 0x10c) + fVar32;
            auVar77 = vsubps_avx(auVar9,auVar55);
            auVar13._4_4_ = fVar90 + fVar64 * *(float *)(uVar16 + 0x134);
            auVar13._0_4_ = fVar89 + fVar56 * *(float *)(uVar16 + 0x130);
            auVar13._8_4_ = fVar91 + fVar65 * *(float *)(uVar16 + 0x138);
            auVar13._12_4_ = fVar92 + fVar66 * *(float *)(uVar16 + 0x13c);
            auVar78 = vsubps_avx(auVar13,auVar55);
            auVar63._0_4_ = fVar93 * auVar25._0_4_;
            auVar63._4_4_ = fVar94 * auVar25._4_4_;
            auVar63._8_4_ = fVar95 * auVar25._8_4_;
            auVar63._12_4_ = fVar96 * auVar25._12_4_;
            auVar29._0_4_ = fVar93 * auVar34._0_4_;
            auVar29._4_4_ = fVar94 * auVar34._4_4_;
            auVar29._8_4_ = fVar95 * auVar34._8_4_;
            auVar29._12_4_ = fVar96 * auVar34._12_4_;
            auVar75._0_4_ = auVar58._0_4_ * fVar41;
            auVar75._4_4_ = auVar58._4_4_ * fVar48;
            auVar75._8_4_ = auVar58._8_4_ * fVar49;
            auVar75._12_4_ = auVar58._12_4_ * fVar50;
            auVar73._0_4_ = fVar85 * auVar77._0_4_;
            auVar73._4_4_ = fVar86 * auVar77._4_4_;
            auVar73._8_4_ = fVar87 * auVar77._8_4_;
            auVar73._12_4_ = fVar88 * auVar77._12_4_;
            auVar40._0_4_ = auVar68._0_4_ * fVar41;
            auVar40._4_4_ = auVar68._4_4_ * fVar48;
            auVar40._8_4_ = auVar68._8_4_ * fVar49;
            auVar40._12_4_ = auVar68._12_4_ * fVar50;
            auVar47._0_4_ = fVar85 * auVar78._0_4_;
            auVar47._4_4_ = fVar86 * auVar78._4_4_;
            auVar47._8_4_ = fVar87 * auVar78._8_4_;
            auVar47._12_4_ = fVar88 * auVar78._12_4_;
            auVar25 = vpminsd_avx(auVar75,auVar40);
            auVar34 = vpminsd_avx(auVar73,auVar47);
            auVar25 = vmaxps_avx(auVar25,auVar34);
            auVar77 = vpminsd_avx(auVar63,auVar29);
            auVar68 = vpmaxsd_avx(auVar63,auVar29);
            auVar34 = vpmaxsd_avx(auVar75,auVar40);
            auVar58 = vpmaxsd_avx(auVar73,auVar47);
            auVar58 = vminps_avx(auVar34,auVar58);
            auVar34 = vmaxps_avx(auVar42,auVar77);
            auVar25 = vmaxps_avx(auVar34,auVar25);
            auVar34 = vminps_avx(auVar43,auVar68);
            auVar34 = vminps_avx(auVar34,auVar58);
            auVar25 = vcmpps_avx(auVar25,auVar34,2);
          }
          else {
            auVar68 = vshufps_avx(ZEXT416((uint)fVar41),ZEXT416((uint)fVar41),0);
            pfVar2 = (float *)(uVar16 + 0x80 + uVar23);
            fVar41 = auVar68._0_4_;
            fVar85 = auVar68._4_4_;
            fVar48 = auVar68._8_4_;
            fVar86 = auVar68._12_4_;
            pfVar1 = (float *)(uVar16 + 0x20 + uVar23);
            auVar35._0_4_ = fVar41 * *pfVar2 + *pfVar1;
            auVar35._4_4_ = fVar85 * pfVar2[1] + pfVar1[1];
            auVar35._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar35._12_4_ = fVar86 * pfVar2[3] + pfVar1[3];
            auVar25 = vsubps_avx(auVar35,auVar82);
            pfVar2 = (float *)(uVar16 + 0x80 + uVar22);
            auVar36._0_4_ = auVar33._0_4_ * auVar25._0_4_;
            auVar36._4_4_ = auVar33._4_4_ * auVar25._4_4_;
            auVar36._8_4_ = auVar33._8_4_ * auVar25._8_4_;
            auVar36._12_4_ = auVar33._12_4_ * auVar25._12_4_;
            pfVar1 = (float *)(uVar16 + 0x20 + uVar22);
            auVar44._0_4_ = fVar41 * *pfVar2 + *pfVar1;
            auVar44._4_4_ = fVar85 * pfVar2[1] + pfVar1[1];
            auVar44._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar44._12_4_ = fVar86 * pfVar2[3] + pfVar1[3];
            auVar25 = vsubps_avx(auVar44,auVar84);
            pfVar2 = (float *)(uVar16 + 0x80 + uVar20);
            pfVar1 = (float *)(uVar16 + 0x20 + uVar20);
            auVar51._0_4_ = fVar41 * *pfVar2 + *pfVar1;
            auVar51._4_4_ = fVar85 * pfVar2[1] + pfVar1[1];
            auVar51._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar51._12_4_ = fVar86 * pfVar2[3] + pfVar1[3];
            auVar45._0_4_ = auVar57._0_4_ * auVar25._0_4_;
            auVar45._4_4_ = auVar57._4_4_ * auVar25._4_4_;
            auVar45._8_4_ = auVar57._8_4_ * auVar25._8_4_;
            auVar45._12_4_ = auVar57._12_4_ * auVar25._12_4_;
            auVar10._4_4_ = fVar8;
            auVar10._0_4_ = fVar8;
            auVar10._8_4_ = fVar8;
            auVar10._12_4_ = fVar8;
            auVar25 = vsubps_avx(auVar51,auVar10);
            auVar52._0_4_ = auVar74._0_4_ * auVar25._0_4_;
            auVar52._4_4_ = auVar74._4_4_ * auVar25._4_4_;
            auVar52._8_4_ = auVar74._8_4_ * auVar25._8_4_;
            auVar52._12_4_ = auVar74._12_4_ * auVar25._12_4_;
            auVar25 = vmaxps_avx(auVar45,auVar52);
            pfVar2 = (float *)(uVar16 + 0x80 + (uVar23 ^ 0x10));
            pfVar1 = (float *)(uVar16 + 0x20 + (uVar23 ^ 0x10));
            auVar53._0_4_ = fVar41 * *pfVar2 + *pfVar1;
            auVar53._4_4_ = fVar85 * pfVar2[1] + pfVar1[1];
            auVar53._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar53._12_4_ = fVar86 * pfVar2[3] + pfVar1[3];
            auVar34 = vsubps_avx(auVar53,auVar82);
            auVar54._0_4_ = auVar33._0_4_ * auVar34._0_4_;
            auVar54._4_4_ = auVar33._4_4_ * auVar34._4_4_;
            auVar54._8_4_ = auVar33._8_4_ * auVar34._8_4_;
            auVar54._12_4_ = auVar33._12_4_ * auVar34._12_4_;
            pfVar2 = (float *)(uVar16 + 0x80 + (uVar22 ^ 0x10));
            pfVar1 = (float *)(uVar16 + 0x20 + (uVar22 ^ 0x10));
            auVar59._0_4_ = fVar41 * *pfVar2 + *pfVar1;
            auVar59._4_4_ = fVar85 * pfVar2[1] + pfVar1[1];
            auVar59._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar59._12_4_ = fVar86 * pfVar2[3] + pfVar1[3];
            auVar34 = vsubps_avx(auVar59,auVar84);
            auVar60._0_4_ = auVar57._0_4_ * auVar34._0_4_;
            auVar60._4_4_ = auVar57._4_4_ * auVar34._4_4_;
            auVar60._8_4_ = auVar57._8_4_ * auVar34._8_4_;
            auVar60._12_4_ = auVar57._12_4_ * auVar34._12_4_;
            pfVar2 = (float *)(uVar16 + 0x80 + (uVar20 ^ 0x10));
            pfVar1 = (float *)(uVar16 + 0x20 + (uVar20 ^ 0x10));
            auVar69._0_4_ = fVar41 * *pfVar2 + *pfVar1;
            auVar69._4_4_ = fVar85 * pfVar2[1] + pfVar1[1];
            auVar69._8_4_ = fVar48 * pfVar2[2] + pfVar1[2];
            auVar69._12_4_ = fVar86 * pfVar2[3] + pfVar1[3];
            auVar34 = vsubps_avx(auVar69,auVar10);
            auVar70._0_4_ = auVar74._0_4_ * auVar34._0_4_;
            auVar70._4_4_ = auVar74._4_4_ * auVar34._4_4_;
            auVar70._8_4_ = auVar74._8_4_ * auVar34._8_4_;
            auVar70._12_4_ = auVar74._12_4_ * auVar34._12_4_;
            auVar58 = vminps_avx(auVar60,auVar70);
            auVar34 = vmaxps_avx(auVar42,auVar36);
            auVar25 = vmaxps_avx(auVar34,auVar25);
            auVar34 = vminps_avx(auVar43,auVar54);
            auVar34 = vminps_avx(auVar34,auVar58);
            if (uVar18 == 6) {
              auVar34 = vcmpps_avx(auVar25,auVar34,2);
              auVar25 = vcmpps_avx(*(undefined1 (*) [16])(uVar16 + 0xe0),auVar68,2);
              auVar58 = vcmpps_avx(auVar68,*(undefined1 (*) [16])(uVar16 + 0xf0),1);
              auVar25 = vandps_avx(auVar25,auVar58);
              auVar25 = vandps_avx(auVar25,auVar34);
            }
            else {
              auVar25 = vcmpps_avx(auVar25,auVar34,2);
            }
          }
          auVar25 = vpslld_avx(auVar25,0x1f);
          uVar18 = vmovmskps_avx(auVar25);
          if (uVar18 == 0) goto LAB_002bc6fd;
          uVar18 = uVar18 & 0xff;
          lVar6 = 0;
          if (uVar18 != 0) {
            for (; (uVar18 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
            }
          }
          uVar17 = *(ulong *)(uVar16 + lVar6 * 8);
          uVar18 = uVar18 - 1 & uVar18;
          if (uVar18 != 0) {
            *puVar21 = uVar17;
            puVar21 = puVar21 + 1;
            lVar6 = 0;
            if (uVar18 != 0) {
              for (; (uVar18 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
              }
            }
            uVar17 = *(ulong *)(uVar16 + lVar6 * 8);
            uVar18 = uVar18 - 1 & uVar18;
            uVar19 = (ulong)uVar18;
            if (uVar18 != 0) {
              do {
                *puVar21 = uVar17;
                puVar21 = puVar21 + 1;
                lVar6 = 0;
                if (uVar19 != 0) {
                  for (; (uVar19 >> lVar6 & 1) == 0; lVar6 = lVar6 + 1) {
                  }
                }
                uVar17 = *(ulong *)(uVar16 + lVar6 * 8);
                uVar19 = uVar19 & uVar19 - 1;
              } while (uVar19 != 0);
            }
          }
        }
        cVar15 = (**(code **)((long)This->leafIntersector +
                             (ulong)*(byte *)(uVar17 & 0xfffffffffffffff0) * 0x40 + 8))
                           (local_818,ray,context);
      } while (cVar15 == '\0');
      ray->tfar = -INFINITY;
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }